

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O0

void add_combine_accum_help(int x,int *accum)

{
  int *accum_local;
  int x_local;
  
  if (x != 0x7ffffffe) {
    if (x == 0x7fffffff) {
      if (*accum == 0x7ffffffe) {
        *accum = 0x7fffffff;
      }
    }
    else if ((*accum == 0x7fffffff) || (*accum == 0x7ffffffe)) {
      *accum = x;
    }
    else if (x < 1) {
      if (x < 0) {
        if (*accum < -0x80000000 - x) {
          *accum = -0x80000000;
        }
        else {
          *accum = x + *accum;
        }
      }
    }
    else if (0x7ffffffd - x < *accum) {
      *accum = 0x7ffffffd;
    }
    else {
      *accum = x + *accum;
    }
  }
  return;
}

Assistant:

static void add_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
		*accum = x;
		return;
	}
	/*
	 * Just in case, guard against overflow or underflow.  Also guard
	 * adding up to the special values which are equal to INT_MAX and
	 * INT_MAX - 1.
	 */
	if (x > 0) {
		if (*accum <= INT_MAX - 2 - x) {
			*accum += x;
		} else {
			*accum = INT_MAX - 2;
		}
	} else if (x < 0) {
		if (*accum >= INT_MIN - x) {
			*accum += x;
		} else {
			*accum = INT_MIN;
		}
	}
}